

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O2

bool __thiscall
FirewirePort::ReadBlockNode
          (FirewirePort *this,nodeid_t node,nodeaddr_t addr,quadlet_t *rdata,uint nbytes,
          uchar param_5)

{
  int iVar1;
  bool bVar2;
  allocator<char> local_51;
  string local_50 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_50,"FirewirePort::ReadBlock",&local_51);
  iVar1 = (*(this->super_BasePort)._vptr_BasePort[0x1b])(this,local_50,0);
  std::__cxx11::string::~string(local_50);
  if ((char)iVar1 == '\0') {
    bVar2 = false;
  }
  else {
    (this->super_BasePort).rtRead = true;
    iVar1 = raw1394_read(this->handle,node + this->baseNodeId,addr,nbytes,rdata);
    bVar2 = iVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool FirewirePort::ReadBlockNode(nodeid_t node, nodeaddr_t addr, quadlet_t *rdata,
                                 unsigned int nbytes, unsigned char)
{
    if (!CheckFwBusGeneration("FirewirePort::ReadBlock"))
        return false;

    rtRead = true;   // for debugging
    return !raw1394_read(handle, baseNodeId+node, addr, nbytes, rdata);
}